

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O3

bool tcu::anon_unknown_3::verifyLineGroupPixelIndependentInterpolation
               (Surface *surface,LineSceneSpec *scene,RasterizationArguments *args,TestLog *log,
               LineInterpolationMethod interpolationMethod)

{
  Vec4 *pVVar1;
  Vec4 *pVVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  float fVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  RasterizationArguments *pRVar8;
  bool bVar9;
  int i;
  ulong uVar10;
  pointer pSVar11;
  ostream *poVar12;
  long lVar13;
  allocator_type *paVar14;
  Surface *surface_00;
  SingleSampleNarrowLineCandidate *extraout_RDX;
  SingleSampleNarrowLineCandidate *pSVar15;
  SingleSampleNarrowLineCandidate *extraout_RDX_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int iVar16;
  ulong uVar17;
  ChannelOrder CVar18;
  uint uVar19;
  allocator_type *paVar20;
  allocator_type *paVar21;
  int subpixelBits;
  ChannelOrder CVar22;
  allocator_type *paVar23;
  uint uVar24;
  ulong uVar25;
  pointer pSVar26;
  allocator_type *paVar27;
  int dy;
  int iVar28;
  long lVar29;
  allocator_type *paVar30;
  uint uVar31;
  undefined4 extraout_XMM0_Db;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  undefined1 auVar35 [16];
  float fVar36;
  IVec3 formatLimit;
  Vector<int,_3> res_1;
  Surface errorMask;
  IVec2 viewportSize;
  Vector<float,_3> res_3;
  Vector<float,_3> res_7;
  Vector<float,_3> res_6;
  Vector<float,_3> res_4;
  Vector<float,_3> res_5;
  Vector<float,_3> res_2;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> screenspaceLines;
  IVec3 pixelNativeColor;
  LineInterpolationRange range;
  TextureLevel referenceLineMap;
  allocator_type *local_548;
  int local_53c;
  allocator_type *local_530;
  string local_520;
  TextureFormat local_500;
  ulong local_4f8;
  int local_4ec;
  undefined8 local_4e8;
  float fStack_4e0;
  float fStack_4dc;
  string local_4d0;
  LineSceneSpec *local_4b0;
  string local_4a8;
  RasterizationArguments *local_488;
  LineInterpolationMethod local_47c;
  undefined8 local_478;
  uint uStack_470;
  uint uStack_46c;
  Surface local_460;
  undefined8 local_448;
  int iStack_440;
  int iStack_43c;
  IVec2 local_438;
  undefined1 local_430 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  Vector<float,_3> local_410;
  Vector<float,_3> local_400;
  float local_3f0 [4];
  Vector<float,_3> local_3e0;
  float local_3d0 [4];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_3c0;
  string local_3a8;
  string local_388;
  LogImageSet local_368;
  float local_328;
  float local_318 [4];
  float local_308 [4];
  float local_2f8 [4];
  float local_2e8 [4];
  float local_2d8 [4];
  undefined1 local_2c8 [8];
  undefined8 uStack_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  _Alloc_hider local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298 [6];
  undefined1 local_230 [8];
  undefined1 auStack_228 [24];
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float local_204;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_200 [4];
  ios_base local_1b8 [264];
  TextureLevel local_b0;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  PixelBufferAccess local_58;
  
  local_438.m_data[0] = surface->m_width;
  local_438.m_data[1] = surface->m_height;
  local_47c = interpolationMethod;
  Surface::Surface(&local_460,local_438.m_data[0],local_438.m_data[1]);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&local_3c0,
             (long)(scene->lines).
                   super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(scene->lines).
                   super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)local_230);
  local_230._0_4_ = R;
  local_230._4_4_ = UNSIGNED_INT8;
  TextureLevel::TextureLevel
            (&local_b0,(TextureFormat *)local_230,surface->m_width,surface->m_height,1);
  TextureLevel::getAccess((PixelBufferAccess *)local_230,&local_b0);
  local_2c8._0_4_ = 0.0;
  local_2c8._4_4_ = 0.0;
  uStack_2c0._0_4_ = 0.0;
  uStack_2c0._4_4_ = 0.0;
  tcu::clear((PixelBufferAccess *)local_230,(IVec4 *)local_2c8);
  local_2c8._0_4_ = RGBA;
  local_2c8._4_4_ = UNORM_INT8;
  if ((void *)local_460.m_pixels.m_cap != (void *)0x0) {
    local_460.m_pixels.m_cap = (size_t)local_460.m_pixels.m_ptr;
  }
  PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_230,(TextureFormat *)local_2c8,local_460.m_width,
             local_460.m_height,1,(void *)local_460.m_pixels.m_cap);
  _local_2c8 = (float  [4])(ZEXT816(0x3f80000000000000) << 0x40);
  tcu::clear((PixelBufferAccess *)local_230,(Vec4 *)local_2c8);
  local_230 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_228);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)auStack_228,"Verifying rasterization result. Native format is RGB",0x34);
  std::ostream::operator<<((ostringstream *)auStack_228,args->redBits);
  std::ostream::operator<<((ostringstream *)auStack_228,args->greenBits);
  std::ostream::operator<<((ostringstream *)auStack_228,args->blueBits);
  MessageBuilder::operator<<((MessageBuilder *)local_230,(EndMessageToken *)&TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_228);
  std::ios_base::~ios_base(local_1b8);
  if (((8 < args->redBits) || (8 < args->greenBits)) || (8 < args->blueBits)) {
    local_230 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_228);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_228,
               "Warning! More than 8 bits in a color channel, this may produce false negatives.",
               0x4f);
    MessageBuilder::operator<<((MessageBuilder *)local_230,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_228);
    std::ios_base::~ios_base(local_1b8);
  }
  genScreenSpaceLines(&local_3c0,&scene->lines,&local_438);
  local_4f8 = CONCAT44(local_4f8._4_4_,scene->lineWidth);
  TextureLevel::getAccess(&local_58,&local_b0);
  setMaskMapCoverageBitForLines(&local_3c0,(float)local_4f8,&local_58);
  iVar28 = surface->m_height;
  if (1 < iVar28 + -1) {
    iVar16 = surface->m_width;
    subpixelBits = 1;
    local_53c = 0;
    local_4ec = 0;
    local_500 = (TextureFormat)log;
    local_4b0 = scene;
    local_488 = args;
    do {
      if (1 < iVar16 + -1) {
        uVar19 = 1;
        local_4f8 = 0;
        do {
          pRVar8 = local_488;
          uVar31 = *(uint *)((long)(surface->m_pixels).m_ptr +
                            (long)(int)(iVar16 * subpixelBits + uVar19) * 4);
          convertRGB8ToNativeFormat((anon_unknown_3 *)&local_368,(RGBA *)(ulong)uVar31,local_488);
          iVar28 = -1;
          local_520._M_dataplus._M_p._0_4_ = ~(-1 << ((byte)pRVar8->redBits & 0x1f));
          local_520._M_dataplus._M_p._4_4_ = ~(-1 << ((byte)pRVar8->greenBits & 0x1f));
          local_520._M_string_length._0_4_ = ~(-1 << ((byte)pRVar8->blueBits & 0x1f));
          CVar18 = 0xffff;
          CVar22 = R;
          do {
            iVar16 = 0;
            do {
              TextureLevel::getAccess((PixelBufferAccess *)local_230,&local_b0);
              ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)local_2c8,(int)(PixelBufferAccess *)local_230,
                         (int)local_4f8 + iVar16,iVar28 + subpixelBits);
              CVar22 = CVar22 | local_2c8._0_4_;
              CVar18 = CVar18 & local_2c8._0_4_;
              iVar16 = iVar16 + 1;
            } while (iVar16 != 3);
            iVar28 = iVar28 + 1;
          } while (iVar28 != 2);
          if ((CVar18 != R) ||
             (bVar9 = compareColors((RGBA *)(ulong)uVar31,(RGBA *)0xff000000,local_488->redBits,
                                    local_488->greenBits,local_488->blueBits),
             log = (TestLog *)local_500, !bVar9)) {
            pSVar26 = (local_4b0->lines).
                      super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pSVar11 = (local_4b0->lines).
                      super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            log = (TestLog *)local_500;
            if ((int)((ulong)((long)pSVar11 - (long)pSVar26) >> 6) < 1) {
              local_530 = (allocator_type *)0x0;
              paVar20 = (allocator_type *)0x0;
              local_548 = (allocator_type *)0x0;
            }
            else {
              lVar29 = 0;
              local_548 = (allocator_type *)0x0;
              paVar20 = (allocator_type *)0x0;
              local_530 = (allocator_type *)0x0;
              do {
                if ((CVar22 >> ((ChannelOrder)lVar29 & (sBGR|sRGBA)) & 1) != 0) {
                  fVar34 = *(float *)((long)pSVar26[lVar29].positions[0].m_data + 0xc);
                  fVar36 = *(float *)((long)(pSVar26[lVar29].positions + 1) + 0xc);
                  local_4a8._M_dataplus._M_p =
                       *(pointer *)
                        local_3c0.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar29].m_data;
                  local_4d0._M_dataplus._M_p =
                       *(pointer *)
                        (local_3c0.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar29].m_data + 2);
                  if (local_47c == LINEINTERPOLATION_STRICTLY_CORRECT) {
                    tcu::(anonymous_namespace)::
                    calcSingleSampleLineInterpolationRangeWithWeightEquation<tcu::(anonymous_namespace)::LineInterpolationRange(*)(tcu::Vector<float,2>const&,float,tcu::Vector<float,2>const&,float,tcu::Vector<float,2>const&)>
                              ((_anonymous_namespace_ *)local_2c8,(Vec2 *)&local_4a8,fVar34,
                               (Vec2 *)&local_4d0,fVar36,(IVec2 *)(ulong)uVar19,subpixelBits,
                               (_func_LineInterpolationRange_Vector<float,_2>_ptr_float_Vector<float,_2>_ptr_float_Vector<float,_2>_ptr
                                *)(ulong)(uint)local_488->subpixelBits);
                  }
                  else {
                    tcu::(anonymous_namespace)::
                    calcSingleSampleLineInterpolationRangeWithWeightEquation<tcu::(anonymous_namespace)::LineInterpolationRange(*)(tcu::Vector<float,2>const&,float,tcu::Vector<float,2>const&,float,tcu::Vector<float,2>const&)>
                              ((_anonymous_namespace_ *)local_2c8,(Vec2 *)&local_4a8,fVar34,
                               (Vec2 *)&local_4d0,fVar36,(IVec2 *)(ulong)uVar19,subpixelBits,
                               (_func_LineInterpolationRange_Vector<float,_2>_ptr_float_Vector<float,_2>_ptr_float_Vector<float,_2>_ptr
                                *)(ulong)(uint)local_488->subpixelBits);
                  }
                  pSVar26 = (local_4b0->lines).
                            super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  fVar34 = 1.0;
                  if ((float)uStack_2c0 <= 1.0) {
                    fVar34 = (float)uStack_2c0;
                  }
                  fVar34 = (float)(~-(uint)((float)uStack_2c0 < 0.0) & (uint)fVar34);
                  pVVar1 = pSVar26[lVar29].colors;
                  pVVar2 = pSVar26[lVar29].colors + 1;
                  fVar36 = 1.0;
                  if (uStack_2c0._4_4_ <= 1.0) {
                    fVar36 = uStack_2c0._4_4_;
                  }
                  fVar36 = (float)(~-(uint)(uStack_2c0._4_4_ < 0.0) & (uint)fVar36);
                  local_78 = fVar36 * pVVar2->m_data[0] + fVar34 * pVVar1->m_data[0];
                  fStack_74 = fVar36 * pVVar2->m_data[1] + fVar34 * pVVar1->m_data[1];
                  fStack_70 = fVar36 * pVVar2->m_data[2] + fVar34 * pVVar1->m_data[2];
                  fVar34 = 1.0;
                  if ((float)local_2c8._0_4_ <= 1.0) {
                    fVar34 = (float)local_2c8._0_4_;
                  }
                  fVar34 = (float)(~-(uint)((float)local_2c8._0_4_ < 0.0) & (uint)fVar34);
                  fVar36 = 1.0;
                  if ((float)local_2c8._4_4_ <= 1.0) {
                    fVar36 = (float)local_2c8._4_4_;
                  }
                  fVar36 = (float)(~-(uint)((float)local_2c8._4_4_ < 0.0) & (uint)fVar36);
                  auVar32._0_4_ = (float)(int)(uint)local_520._M_dataplus._M_p;
                  fStack_6c = fVar36 * pVVar2->m_data[0] + fVar34 * pVVar1->m_data[0];
                  local_88 = fVar36 * pVVar2->m_data[1] + fVar34 * pVVar1->m_data[1];
                  fStack_84 = fVar36 * pVVar2->m_data[2] + fVar34 * pVVar1->m_data[2];
                  fStack_7c = fVar36 * pVVar2->m_data[3] + fVar34 * pVVar1->m_data[3];
                  auVar35._0_4_ = (float)(int)local_520._M_dataplus._M_p._4_4_;
                  auVar35._4_4_ = (float)(int)(uint)local_520._M_string_length;
                  auVar35._8_8_ = 0;
                  auVar32._4_4_ = auVar35._0_4_;
                  auVar32._8_4_ = auVar35._4_4_;
                  auVar32._12_4_ = auVar32._0_4_;
                  auVar33._4_4_ = fStack_74 * auVar35._0_4_;
                  auVar33._0_4_ = local_78 * auVar32._0_4_;
                  auVar33._8_4_ = fStack_70 * auVar35._4_4_;
                  auVar33._12_4_ = fStack_6c * auVar32._0_4_;
                  auVar33 = minps(auVar32,auVar33);
                  fStack_4e0 = (float)(-(uint)(0.0 <= fStack_70 * auVar35._4_4_) & auVar33._8_4_);
                  fStack_4dc = (float)(-(uint)(0.0 <= fStack_6c * auVar32._0_4_) & auVar33._12_4_);
                  local_4e8 = CONCAT44(-(uint)(0.0 <= fStack_74 * auVar35._0_4_) & auVar33._4_4_,
                                       -(uint)(0.0 <= local_78 * auVar32._0_4_) & auVar33._0_4_);
                  auVar6._4_4_ = fStack_84 * auVar35._4_4_;
                  auVar6._0_4_ = local_88 * auVar35._0_4_;
                  auVar6._8_4_ = fStack_84 * 0.0;
                  auVar6._12_4_ = fStack_7c * 0.0;
                  auVar33 = minps(auVar35,auVar6);
                  uStack_470 = -(uint)(0.0 <= fStack_84 * 0.0) & auVar33._8_4_;
                  uStack_46c = -(uint)(0.0 <= fStack_7c * 0.0) & auVar33._12_4_;
                  local_478 = (allocator_type *)
                              CONCAT44(-(uint)(0.0 <= fStack_84 * auVar35._4_4_) & auVar33._4_4_,
                                       -(uint)(0.0 <= local_88 * auVar35._0_4_) & auVar33._0_4_);
                  fStack_80 = fStack_84;
                  fVar34 = floorf(fStack_4e0);
                  local_448 = CONCAT44(extraout_XMM0_Db,fVar34);
                  local_328 = ceilf(local_4e8._4_4_);
                  local_68 = floorf((float)local_4e8);
                  fVar34 = floorf(local_4e8._4_4_);
                  iStack_440 = (int)(float)local_448;
                  iStack_43c = (int)local_328;
                  local_448 = CONCAT44((int)fVar34,(int)local_68);
                  local_328 = ceilf((float)local_478);
                  fVar34 = ceilf(local_478._4_4_);
                  iVar28 = (int)local_328;
                  iVar16 = (int)fVar34;
                  pSVar15 = extraout_RDX;
                  if ((int)(ChannelType)local_448 <= (int)local_368.m_name._M_dataplus._M_p) {
                    pSVar15 = (SingleSampleNarrowLineCandidate *)(ulong)local_448._4_4_;
                    if ((((int)local_448._4_4_ <= local_368.m_name._M_dataplus._M_p._4_4_) &&
                        (pSVar15 = (SingleSampleNarrowLineCandidate *)
                                   (ulong)(uint)local_368.m_name._M_string_length,
                        iStack_440 <= (int)(uint)local_368.m_name._M_string_length)) &&
                       (((int)local_368.m_name._M_dataplus._M_p <= iStack_43c &&
                        ((local_368.m_name._M_dataplus._M_p._4_4_ <= iVar28 &&
                         ((int)(uint)local_368.m_name._M_string_length <= iVar16))))))
                    goto LAB_019d7c59;
                  }
                  if (local_53c < 4) {
                    local_230._4_4_ = (ChannelType)local_448;
                    local_230._0_4_ = (ChannelOrder)lVar29;
                    auStack_228._0_4_ = local_448._4_4_;
                    auStack_228._4_4_ = iStack_440;
                    auStack_228._8_4_ = iStack_43c;
                    auStack_228._20_4_ = (undefined4)local_4e8;
                    fStack_210 = (float)(local_4e8 >> 0x20);
                    fStack_20c = fStack_4e0;
                    fStack_208 = fStack_4dc;
                    local_204 = SUB84(local_478,0);
                    aaStack_200[0]._M_allocated_capacity._0_4_ =
                         (undefined4)((ulong)local_478 >> 0x20);
                    aaStack_200[1]._0_4_ = fStack_6c;
                    aaStack_200[0]._12_4_ = fStack_70;
                    aaStack_200[0]._M_allocated_capacity._4_4_ = local_78;
                    aaStack_200[0]._8_4_ = fStack_74;
                    aaStack_200[1]._8_4_ = (int)fStack_84;
                    aaStack_200[1]._4_4_ = (ChannelType)local_88;
                    auStack_228._12_4_ = iVar28;
                    auStack_228._16_4_ = iVar16;
                    if (paVar20 == local_530) {
                      uVar25 = (long)paVar20 - (long)local_548;
                      if (uVar25 == 0x7fffffffffffffc8) {
                        std::__throw_length_error("vector::_M_realloc_insert");
                      }
                      uVar17 = ((long)uVar25 >> 2) * -0x79435e50d79435e5;
                      uVar10 = uVar17;
                      if (paVar20 == local_548) {
                        uVar10 = 1;
                      }
                      local_4e8 = uVar10 + uVar17;
                      if (0x1af286bca1af285 < local_4e8) {
                        local_4e8 = 0x1af286bca1af286;
                      }
                      if (CARRY8(uVar10,uVar17)) {
                        local_4e8 = 0x1af286bca1af286;
                      }
                      if (local_4e8 == 0) {
                        paVar14 = (allocator_type *)0x0;
                        pSVar15 = (SingleSampleNarrowLineCandidate *)0x0;
                      }
                      else {
                        paVar14 = (allocator_type *)operator_new(local_4e8 * 0x4c);
                        pSVar15 = extraout_RDX_00;
                      }
                      std::
                      allocator_traits<std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>>
                      ::
                      construct<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate_const&>
                                (paVar14 + ((long)uVar25 >> 2) * 4,
                                 (SingleSampleNarrowLineCandidate *)local_230,pSVar15);
                      paVar21 = paVar14;
                      for (paVar30 = local_548; paVar20 != paVar30; paVar30 = paVar30 + 0x4c) {
                        *(undefined4 *)paVar21 = *(undefined4 *)paVar30;
                        lVar13 = 1;
                        do {
                          *(undefined4 *)(paVar21 + lVar13 * 4) =
                               *(undefined4 *)(paVar30 + lVar13 * 4);
                          lVar13 = lVar13 + 1;
                        } while (lVar13 != 4);
                        lVar13 = 4;
                        do {
                          *(undefined4 *)(paVar21 + lVar13 * 4) =
                               *(undefined4 *)(paVar30 + lVar13 * 4);
                          lVar13 = lVar13 + 1;
                        } while (lVar13 != 7);
                        lVar13 = 7;
                        do {
                          *(undefined4 *)(paVar21 + lVar13 * 4) =
                               *(undefined4 *)(paVar30 + lVar13 * 4);
                          lVar13 = lVar13 + 1;
                        } while (lVar13 != 10);
                        lVar13 = 10;
                        do {
                          *(undefined4 *)(paVar21 + lVar13 * 4) =
                               *(undefined4 *)(paVar30 + lVar13 * 4);
                          lVar13 = lVar13 + 1;
                        } while (lVar13 != 0xd);
                        lVar13 = 0xd;
                        do {
                          *(undefined4 *)(paVar21 + lVar13 * 4) =
                               *(undefined4 *)(paVar30 + lVar13 * 4);
                          lVar13 = lVar13 + 1;
                        } while (lVar13 != 0x10);
                        lVar13 = 0x10;
                        do {
                          *(undefined4 *)(paVar21 + lVar13 * 4) =
                               *(undefined4 *)(paVar30 + lVar13 * 4);
                          lVar13 = lVar13 + 1;
                        } while (lVar13 != 0x13);
                        paVar21 = paVar21 + 0x4c;
                      }
                      if (local_548 != (allocator_type *)0x0) {
                        operator_delete(local_548,uVar25);
                      }
                      local_530 = paVar14 + local_4e8 * 0x4c;
                      log = (TestLog *)local_500;
                      local_548 = paVar14;
                    }
                    else {
                      std::
                      allocator_traits<std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>>
                      ::
                      construct<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate_const&>
                                (paVar20,(SingleSampleNarrowLineCandidate *)local_230,pSVar15);
                      paVar21 = paVar20;
                    }
                    paVar20 = paVar21 + 0x4c;
                    pSVar26 = (local_4b0->lines).
                              super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  }
                  pSVar11 = (local_4b0->lines).
                            super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                }
                lVar29 = lVar29 + 1;
              } while (lVar29 < (int)((ulong)((long)pSVar11 - (long)pSVar26) >> 6));
            }
            local_4ec = local_4ec + 1;
            *(undefined4 *)
             ((long)local_460.m_pixels.m_ptr +
             (long)(int)(local_460.m_width * subpixelBits + uVar19) * 4) = 0xff0000ff;
            local_53c = local_53c + 1;
            if (local_53c < 4) {
              local_230 = (undefined1  [8])log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_228);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)auStack_228,"Found an invalid pixel at (",0x1b);
              std::ostream::operator<<((ostringstream *)auStack_228,uVar19);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_228,",",1);
              std::ostream::operator<<((ostringstream *)auStack_228,subpixelBits);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_228,"), ",3);
              uVar24 = (int)((long)paVar20 - (long)local_548 >> 2) * 0x286bca1b;
              std::ostream::operator<<((ostringstream *)auStack_228,uVar24);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)auStack_228," candidate reference value(s) found:\n",0x25);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)auStack_228,"\tPixel color:\t\t",0xf);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_228,"RGBA(",5);
              poVar12 = (ostream *)
                        std::ostream::operator<<((ostringstream *)auStack_228,uVar31 & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
              poVar12 = (ostream *)std::ostream::operator<<(poVar12,uVar31 >> 8 & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
              poVar12 = (ostream *)std::ostream::operator<<(poVar12,uVar31 >> 0x10 & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
              poVar12 = (ostream *)std::ostream::operator<<(poVar12,uVar31 >> 0x18);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,")",1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_228,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)auStack_228,"\tNative color:\t\t",0x10);
              tcu::operator<<((ostream *)auStack_228,(Vector<int,_3> *)&local_368);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_228,"\n",1);
              MessageBuilder::operator<<
                        ((MessageBuilder *)local_230,(EndMessageToken *)&TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_228);
              std::ios_base::~ios_base(local_1b8);
              if ((int)uVar24 < 1) goto LAB_019d7c59;
              local_448 = (ulong)(uVar24 & 0x7fffffff);
              paVar20 = local_548 + 4;
              paVar14 = local_548 + 0x10;
              paVar21 = local_548 + 0x1c;
              paVar30 = local_548 + 0x28;
              paVar27 = local_548 + 0x34;
              paVar23 = local_548 + 0x40;
              local_4e8 = 0;
              do {
                local_230._0_4_ = local_500.order;
                local_230._4_4_ = local_500.type;
                local_478 = paVar14;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_228);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)auStack_228,"\tCandidate (line ",0x11);
                std::ostream::operator<<
                          ((ostringstream *)auStack_228,*(int *)(local_548 + local_4e8 * 0x4c));
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_228,"):\n",3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)auStack_228,"\t\tReference native color min: ",0x1e);
                local_4a8._M_dataplus._M_p = (pointer)0x0;
                local_4a8._M_string_length._0_4_ = 0;
                uStack_2c0._0_4_ = 0.0;
                auVar7._8_8_ = 0;
                auVar7._0_8_ = uStack_2c0;
                _local_2c8 = (float  [4])(auVar7 << 0x40);
                lVar29 = 0;
                do {
                  iVar28 = *(int *)(paVar20 + lVar29 * 4);
                  iVar16 = *(int *)((long)&local_520._M_dataplus._M_p + lVar29 * 4);
                  if (iVar28 < iVar16) {
                    iVar16 = iVar28;
                  }
                  iVar5 = *(int *)((long)&local_4a8._M_dataplus._M_p + lVar29 * 4);
                  if (iVar28 < iVar5) {
                    iVar16 = iVar5;
                  }
                  *(int *)(local_2c8 + lVar29 * 4) = iVar16;
                  lVar29 = lVar29 + 1;
                } while (lVar29 != 3);
                tcu::operator<<((ostream *)auStack_228,(Vector<int,_3> *)local_2c8);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_228,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)auStack_228,"\t\tReference native color max: ",0x1e);
                local_388._M_dataplus._M_p = (pointer)0x0;
                local_388._M_string_length._0_4_ = 0;
                local_4d0._M_string_length._0_4_ = 0;
                local_4d0._M_dataplus._M_p = (pointer)0x0;
                lVar29 = 0;
                do {
                  iVar28 = *(int *)(local_478 + lVar29 * 4);
                  iVar16 = *(int *)((long)&local_520._M_dataplus._M_p + lVar29 * 4);
                  if (iVar28 < iVar16) {
                    iVar16 = iVar28;
                  }
                  iVar5 = *(int *)((long)&local_388._M_dataplus._M_p + lVar29 * 4);
                  if (iVar28 < iVar5) {
                    iVar16 = iVar5;
                  }
                  *(int *)((long)&local_4d0._M_dataplus._M_p + lVar29 * 4) = iVar16;
                  lVar29 = lVar29 + 1;
                } while (lVar29 != 3);
                tcu::operator<<((ostream *)auStack_228,(Vector<int,_3> *)&local_4d0);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_228,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)auStack_228,"\t\tReference native float min: ",0x1e);
                local_3a8._M_dataplus._M_p = (pointer)0x0;
                local_3a8._M_string_length._0_4_ = 0;
                local_3d0[2] = 0.0;
                local_3d0[0] = 0.0;
                local_3d0[1] = 0.0;
                lVar29 = 0;
                do {
                  local_3d0[lVar29] =
                       (float)*(int *)((long)&local_520._M_dataplus._M_p + lVar29 * 4);
                  lVar29 = lVar29 + 1;
                } while (lVar29 != 3);
                local_430._8_4_ = 0.0;
                local_430._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                lVar29 = 0;
                do {
                  fVar34 = *(float *)(paVar21 + lVar29 * 4);
                  fVar36 = *(float *)((long)&local_3a8._M_dataplus._M_p + lVar29 * 4);
                  fVar4 = local_3d0[lVar29];
                  if (fVar34 <= local_3d0[lVar29]) {
                    fVar4 = fVar34;
                  }
                  uVar31 = -(uint)(fVar34 < fVar36);
                  *(uint *)(local_430 + lVar29 * 4) = uVar31 & (uint)fVar36 | ~uVar31 & (uint)fVar4;
                  lVar29 = lVar29 + 1;
                } while (lVar29 != 3);
                tcu::operator<<((ostream *)auStack_228,(Vector<float,_3> *)local_430);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_228,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)auStack_228,"\t\tReference native float max: ",0x1e);
                local_2d8[0] = 0.0;
                local_2d8[1] = 0.0;
                local_2d8[2] = 0.0;
                local_3f0[2] = 0.0;
                local_3f0[0] = 0.0;
                local_3f0[1] = 0.0;
                lVar29 = 0;
                do {
                  local_3f0[lVar29] =
                       (float)*(int *)((long)&local_520._M_dataplus._M_p + lVar29 * 4);
                  lVar29 = lVar29 + 1;
                } while (lVar29 != 3);
                local_3e0.m_data[2] = 0.0;
                local_3e0.m_data[0] = 0.0;
                local_3e0.m_data[1] = 0.0;
                lVar29 = 0;
                do {
                  fVar34 = *(float *)(paVar30 + lVar29 * 4);
                  fVar36 = local_3f0[lVar29];
                  if (fVar34 <= local_3f0[lVar29]) {
                    fVar36 = fVar34;
                  }
                  uVar31 = -(uint)(fVar34 < local_2d8[lVar29]);
                  local_3e0.m_data[lVar29] =
                       (float)(uVar31 & (uint)local_2d8[lVar29] | ~uVar31 & (uint)fVar36);
                  lVar29 = lVar29 + 1;
                } while (lVar29 != 3);
                tcu::operator<<((ostream *)auStack_228,&local_3e0);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_228,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)auStack_228,"\t\tFmin:\t",8);
                local_2e8[0] = 0.0;
                local_2e8[1] = 0.0;
                local_2e8[2] = 0.0;
                local_2f8[0] = 1.0;
                local_2f8[1] = 1.0;
                local_2f8[2] = 1.0;
                local_400.m_data[2] = 0.0;
                local_400.m_data[0] = 0.0;
                local_400.m_data[1] = 0.0;
                lVar29 = 0;
                do {
                  fVar34 = *(float *)(paVar27 + lVar29 * 4);
                  fVar36 = local_2f8[lVar29];
                  if (fVar34 <= local_2f8[lVar29]) {
                    fVar36 = fVar34;
                  }
                  uVar31 = -(uint)(fVar34 < local_2e8[lVar29]);
                  local_400.m_data[lVar29] =
                       (float)(uVar31 & (uint)local_2e8[lVar29] | ~uVar31 & (uint)fVar36);
                  lVar29 = lVar29 + 1;
                } while (lVar29 != 3);
                tcu::operator<<((ostream *)auStack_228,&local_400);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_228,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)auStack_228,"\t\tFmax:\t",8);
                local_308[0] = 0.0;
                local_308[1] = 0.0;
                local_308[2] = 0.0;
                local_318[0] = 1.0;
                local_318[1] = 1.0;
                local_318[2] = 1.0;
                local_410.m_data[2] = 0.0;
                local_410.m_data[0] = 0.0;
                local_410.m_data[1] = 0.0;
                lVar29 = 0;
                do {
                  fVar34 = *(float *)(paVar23 + lVar29 * 4);
                  fVar36 = local_318[lVar29];
                  if (fVar34 <= local_318[lVar29]) {
                    fVar36 = fVar34;
                  }
                  uVar31 = -(uint)(fVar34 < local_308[lVar29]);
                  local_410.m_data[lVar29] =
                       (float)(uVar31 & (uint)local_308[lVar29] | ~uVar31 & (uint)fVar36);
                  lVar29 = lVar29 + 1;
                } while (lVar29 != 3);
                tcu::operator<<((ostream *)auStack_228,&local_410);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_228,"\n",1);
                MessageBuilder::operator<<
                          ((MessageBuilder *)local_230,(EndMessageToken *)&TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_228);
                std::ios_base::~ios_base(local_1b8);
                local_4e8 = local_4e8 + 1;
                paVar20 = paVar20 + 0x4c;
                paVar14 = local_478 + 0x4c;
                paVar21 = paVar21 + 0x4c;
                paVar30 = paVar30 + 0x4c;
                paVar27 = paVar27 + 0x4c;
                paVar23 = paVar23 + 0x4c;
                log = (TestLog *)local_500;
              } while (local_4e8 != local_448);
            }
            else {
LAB_019d7c59:
              if (local_548 == (allocator_type *)0x0) goto LAB_019d7c70;
            }
            operator_delete(local_548,(long)local_530 - (long)local_548);
          }
LAB_019d7c70:
          uVar19 = uVar19 + 1;
          iVar16 = surface->m_width;
          local_4f8 = (ulong)((int)local_4f8 + 1);
        } while ((int)uVar19 < iVar16 + -1);
        iVar28 = surface->m_height;
      }
      iVar5 = local_4ec;
      subpixelBits = subpixelBits + 1;
    } while (subpixelBits < iVar28 + -1);
    if (4 < local_53c) {
      local_230 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_228);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_228,"Omitted ",8);
      std::ostream::operator<<((ostringstream *)auStack_228,local_53c + -4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_228," pixel error description(s).",0x1c);
      MessageBuilder::operator<<
                ((MessageBuilder *)local_230,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_228);
      std::ios_base::~ios_base(local_1b8);
    }
    if (iVar5 != 0) {
      local_230 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_228);
      std::ostream::operator<<((ostringstream *)auStack_228,iVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_228," invalid pixel(s) found.",0x18);
      MessageBuilder::operator<<
                ((MessageBuilder *)local_230,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_228);
      std::ios_base::~ios_base(local_1b8);
      local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"Verification result","")
      ;
      local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"Result of rendering","")
      ;
      LogImageSet::LogImageSet(&local_368,&local_520,&local_4a8);
      TestLog::startImageSet
                (log,local_368.m_name._M_dataplus._M_p,local_368.m_description._M_dataplus._M_p);
      local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"Result","");
      local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"Result","");
      LogImage::LogImage((LogImage *)local_230,&local_4d0,&local_388,surface,
                         QP_IMAGE_COMPRESSION_MODE_BEST);
      LogImage::write((LogImage *)local_230,(ChannelOrder)log,__buf,(size_t)surface);
      local_430._0_8_ = &local_420;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"ErrorMask","");
      local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"ErrorMask","");
      surface_00 = &local_460;
      LogImage::LogImage((LogImage *)local_2c8,(string *)local_430,&local_3a8,surface_00,
                         QP_IMAGE_COMPRESSION_MODE_BEST);
      LogImage::write((LogImage *)local_2c8,(ChannelOrder)log,__buf_00,(size_t)surface_00);
      TestLog::endImageSet(log);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_p != local_298) {
        operator_delete(local_2a8._M_p,local_298[0]._M_allocated_capacity + 1);
      }
      if (local_2c8 != (undefined1  [8])&local_2b8) {
        operator_delete((void *)local_2c8,local_2b8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._0_8_ != &local_420) {
        operator_delete((void *)local_430._0_8_,local_420._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(fStack_20c,fStack_210) != aaStack_200) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(fStack_20c,fStack_210),
                        CONCAT44(aaStack_200[0]._M_allocated_capacity._4_4_,
                                 (undefined4)aaStack_200[0]._M_allocated_capacity) + 1);
      }
      if (local_230 != (undefined1  [8])((long)auStack_228 + 8)) {
        operator_delete((void *)local_230,CONCAT44(auStack_228._12_4_,auStack_228._8_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != &local_388.field_2) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
        operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368.m_description._M_dataplus._M_p != &local_368.m_description.field_2) {
        operator_delete(local_368.m_description._M_dataplus._M_p,
                        local_368.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368.m_name._M_dataplus._M_p != &local_368.m_name.field_2) {
        operator_delete(local_368.m_name._M_dataplus._M_p,
                        local_368.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
        operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_520._M_dataplus._M_p != &local_520.field_2) {
        operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
      }
      bVar9 = false;
      goto LAB_019d82f8;
    }
  }
  local_230 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_228);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)auStack_228,"No invalid pixels found.",0x18);
  MessageBuilder::operator<<((MessageBuilder *)local_230,(EndMessageToken *)&TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_228);
  std::ios_base::~ios_base(local_1b8);
  paVar3 = &local_368.m_name.field_2;
  local_368.m_name._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"Verification result","");
  local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"Result of rendering","");
  LogImageSet::LogImageSet((LogImageSet *)local_2c8,&local_368.m_name,&local_520);
  TestLog::startImageSet(log,(char *)local_2c8,local_2a8._M_p);
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"Result","");
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"Result","");
  LogImage::LogImage((LogImage *)local_230,&local_4a8,&local_4d0,surface,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
  LogImage::write((LogImage *)local_230,(ChannelOrder)log,__buf_01,(size_t)surface);
  TestLog::endImageSet(log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(fStack_20c,fStack_210) != aaStack_200) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(fStack_20c,fStack_210),
                    CONCAT44(aaStack_200[0]._M_allocated_capacity._4_4_,
                             (undefined4)aaStack_200[0]._M_allocated_capacity) + 1);
  }
  if (local_230 != (undefined1  [8])((long)auStack_228 + 8)) {
    operator_delete((void *)local_230,CONCAT44(auStack_228._12_4_,auStack_228._8_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_p != local_298) {
    operator_delete(local_2a8._M_p,local_298[0]._M_allocated_capacity + 1);
  }
  if (local_2c8 != (undefined1  [8])&local_2b8) {
    operator_delete((void *)local_2c8,local_2b8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != &local_520.field_2) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.m_name._M_dataplus._M_p != paVar3) {
    operator_delete(local_368.m_name._M_dataplus._M_p,
                    local_368.m_name.field_2._M_allocated_capacity + 1);
  }
  bVar9 = true;
LAB_019d82f8:
  TextureLevel::~TextureLevel(&local_b0);
  if (local_3c0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3c0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3c0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3c0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  Surface::~Surface(&local_460);
  return bVar9;
}

Assistant:

bool verifyLineGroupPixelIndependentInterpolation (const tcu::Surface&				surface,
												   const LineSceneSpec&				scene,
												   const RasterizationArguments&	args,
												   tcu::TestLog&					log,
												   LineInterpolationMethod			interpolationMethod)
{
	DE_ASSERT(scene.lines.size() < 8); // coverage indices are stored as bitmask in a unsigned 8-bit ints
	DE_ASSERT(interpolationMethod == LINEINTERPOLATION_STRICTLY_CORRECT || interpolationMethod == LINEINTERPOLATION_PROJECTED);

	const tcu::RGBA			invalidPixelColor	= tcu::RGBA(255, 0, 0, 255);
	const tcu::IVec2		viewportSize		= tcu::IVec2(surface.getWidth(), surface.getHeight());
	const int				errorFloodThreshold	= 4;
	int						errorCount			= 0;
	tcu::Surface			errorMask			(surface.getWidth(), surface.getHeight());
	int						invalidPixels		= 0;
	std::vector<tcu::Vec4>	screenspaceLines	(scene.lines.size()); //!< packed (x0, y0, x1, y1)

	// Reference renderer produces correct fragments using the diamond-exit-rule. Make 2D int array, store line coverage as a 8-bit bitfield
	// The map is used to find lines with potential coverage to a given pixel
	tcu::TextureLevel		referenceLineMap	(tcu::TextureFormat(tcu::TextureFormat::R, tcu::TextureFormat::UNSIGNED_INT8), surface.getWidth(), surface.getHeight());

	tcu::clear(referenceLineMap.getAccess(), tcu::IVec4(0, 0, 0, 0));
	tcu::clear(errorMask.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	// log format

	log << tcu::TestLog::Message << "Verifying rasterization result. Native format is RGB" << args.redBits << args.greenBits << args.blueBits << tcu::TestLog::EndMessage;
	if (args.redBits > 8 || args.greenBits > 8 || args.blueBits > 8)
		log << tcu::TestLog::Message << "Warning! More than 8 bits in a color channel, this may produce false negatives." << tcu::TestLog::EndMessage;

	// prepare lookup map

	genScreenSpaceLines(screenspaceLines, scene.lines, viewportSize);
	setMaskMapCoverageBitForLines(screenspaceLines, scene.lineWidth, referenceLineMap.getAccess());

	// Find all possible lines with coverage, check pixel color matches one of them

	for (int y = 1; y < surface.getHeight() - 1; ++y)
	for (int x = 1; x < surface.getWidth()  - 1; ++x)
	{
		const tcu::RGBA		color					= surface.getPixel(x, y);
		const tcu::IVec3	pixelNativeColor		= convertRGB8ToNativeFormat(color, args);	// Convert pixel color from rgba8 to the real pixel format. Usually rgba8 or 565
		int					lineCoverageSet			= 0;										// !< lines that may cover this fragment
		int					lineSurroundingCoverage = 0xFFFF;									// !< lines that will cover this fragment
		bool				matchFound				= false;
		const tcu::IVec3	formatLimit				((1 << args.redBits) - 1, (1 << args.greenBits) - 1, (1 << args.blueBits) - 1);

		std::vector<SingleSampleNarrowLineCandidate> candidates;

		// Find lines with possible coverage

		for (int dy = -1; dy < 2; ++dy)
		for (int dx = -1; dx < 2; ++dx)
		{
			const int coverage = referenceLineMap.getAccess().getPixelInt(x+dx, y+dy).x();

			lineCoverageSet			|= coverage;
			lineSurroundingCoverage	&= coverage;
		}

		// background color is possible?
		if (lineSurroundingCoverage == 0 && compareColors(color, tcu::RGBA::black(), args.redBits, args.greenBits, args.blueBits))
			continue;

		// Check those lines

		for (int lineNdx = 0; lineNdx < (int)scene.lines.size(); ++lineNdx)
		{
			if (((lineCoverageSet >> lineNdx) & 0x01) != 0)
			{
				const float						wa				= scene.lines[lineNdx].positions[0].w();
				const float						wb				= scene.lines[lineNdx].positions[1].w();
				const tcu::Vec2					pa				= screenspaceLines[lineNdx].swizzle(0, 1);
				const tcu::Vec2					pb				= screenspaceLines[lineNdx].swizzle(2, 3);

				const LineInterpolationRange	range			= (interpolationMethod == LINEINTERPOLATION_STRICTLY_CORRECT)
																	? (calcSingleSampleLineInterpolationRange(pa, wa, pb, wb, tcu::IVec2(x, y), args.subpixelBits))
																	: (calcSingleSampleLineInterpolationRangeAxisProjected(pa, wa, pb, wb, tcu::IVec2(x, y), args.subpixelBits));

				const tcu::Vec4					valueMin		= de::clamp(range.min.x(), 0.0f, 1.0f) * scene.lines[lineNdx].colors[0] + de::clamp(range.min.y(), 0.0f, 1.0f) * scene.lines[lineNdx].colors[1];
				const tcu::Vec4					valueMax		= de::clamp(range.max.x(), 0.0f, 1.0f) * scene.lines[lineNdx].colors[0] + de::clamp(range.max.y(), 0.0f, 1.0f) * scene.lines[lineNdx].colors[1];

				const tcu::Vec3					colorMinF		(de::clamp(valueMin.x() * (float)formatLimit.x(), 0.0f, (float)formatLimit.x()),
																 de::clamp(valueMin.y() * (float)formatLimit.y(), 0.0f, (float)formatLimit.y()),
																 de::clamp(valueMin.z() * (float)formatLimit.z(), 0.0f, (float)formatLimit.z()));
				const tcu::Vec3					colorMaxF		(de::clamp(valueMax.x() * (float)formatLimit.x(), 0.0f, (float)formatLimit.x()),
																 de::clamp(valueMax.y() * (float)formatLimit.y(), 0.0f, (float)formatLimit.y()),
																 de::clamp(valueMax.z() * (float)formatLimit.z(), 0.0f, (float)formatLimit.z()));
				const tcu::IVec3				colorMin		((int)deFloatFloor(colorMinF.x()),
																 (int)deFloatFloor(colorMinF.y()),
																 (int)deFloatFloor(colorMinF.z()));
				const tcu::IVec3				colorMax		((int)deFloatCeil (colorMaxF.x()),
																 (int)deFloatCeil (colorMaxF.y()),
																 (int)deFloatCeil (colorMaxF.z()));

				// Verify validity
				if (pixelNativeColor.x() < colorMin.x() ||
					pixelNativeColor.y() < colorMin.y() ||
					pixelNativeColor.z() < colorMin.z() ||
					pixelNativeColor.x() > colorMax.x() ||
					pixelNativeColor.y() > colorMax.y() ||
					pixelNativeColor.z() > colorMax.z())
				{
					if (errorCount < errorFloodThreshold)
					{
						// Store candidate information for logging
						SingleSampleNarrowLineCandidate candidate;

						candidate.lineNdx		= lineNdx;
						candidate.colorMin		= colorMin;
						candidate.colorMax		= colorMax;
						candidate.colorMinF		= colorMinF;
						candidate.colorMaxF		= colorMaxF;
						candidate.valueRangeMin	= valueMin.swizzle(0, 1, 2);
						candidate.valueRangeMax	= valueMax.swizzle(0, 1, 2);

						candidates.push_back(candidate);
					}
				}
				else
				{
					matchFound = true;
					break;
				}
			}
		}

		if (matchFound)
			continue;

		// invalid fragment
		++invalidPixels;
		errorMask.setPixel(x, y, invalidPixelColor);

		++errorCount;

		// don't fill the logs with too much data
		if (errorCount < errorFloodThreshold)
		{
			log << tcu::TestLog::Message
				<< "Found an invalid pixel at (" << x << "," << y << "), " << (int)candidates.size() << " candidate reference value(s) found:\n"
				<< "\tPixel color:\t\t" << color << "\n"
				<< "\tNative color:\t\t" << pixelNativeColor << "\n"
				<< tcu::TestLog::EndMessage;

			for (int candidateNdx = 0; candidateNdx < (int)candidates.size(); ++candidateNdx)
			{
				const SingleSampleNarrowLineCandidate& candidate = candidates[candidateNdx];

				log << tcu::TestLog::Message << "\tCandidate (line " << candidate.lineNdx << "):\n"
					<< "\t\tReference native color min: " << tcu::clamp(candidate.colorMin, tcu::IVec3(0,0,0), formatLimit) << "\n"
					<< "\t\tReference native color max: " << tcu::clamp(candidate.colorMax, tcu::IVec3(0,0,0), formatLimit) << "\n"
					<< "\t\tReference native float min: " << tcu::clamp(candidate.colorMinF, tcu::Vec3(0.0f, 0.0f, 0.0f), formatLimit.cast<float>()) << "\n"
					<< "\t\tReference native float max: " << tcu::clamp(candidate.colorMaxF, tcu::Vec3(0.0f, 0.0f, 0.0f), formatLimit.cast<float>()) << "\n"
					<< "\t\tFmin:\t" << tcu::clamp(candidate.valueRangeMin, tcu::Vec3(0.0f, 0.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 1.0f)) << "\n"
					<< "\t\tFmax:\t" << tcu::clamp(candidate.valueRangeMax, tcu::Vec3(0.0f, 0.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 1.0f)) << "\n"
					<< tcu::TestLog::EndMessage;
			}
		}
	}

	// don't just hide failures
	if (errorCount > errorFloodThreshold)
		log << tcu::TestLog::Message << "Omitted " << (errorCount-errorFloodThreshold) << " pixel error description(s)." << tcu::TestLog::EndMessage;

	// report result
	if (invalidPixels)
	{
		log << tcu::TestLog::Message << invalidPixels << " invalid pixel(s) found." << tcu::TestLog::EndMessage;
		log << tcu::TestLog::ImageSet("Verification result", "Result of rendering")
			<< tcu::TestLog::Image("Result", "Result",			surface)
			<< tcu::TestLog::Image("ErrorMask", "ErrorMask",	errorMask)
			<< tcu::TestLog::EndImageSet;

		return false;
	}
	else
	{
		log << tcu::TestLog::Message << "No invalid pixels found." << tcu::TestLog::EndMessage;
		log << tcu::TestLog::ImageSet("Verification result", "Result of rendering")
			<< tcu::TestLog::Image("Result", "Result", surface)
			<< tcu::TestLog::EndImageSet;

		return true;
	}
}